

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O0

Validity * __thiscall
capnp::compiler::CompilerMain::addSource
          (Validity *__return_storage_ptr__,CompilerMain *this,StringPtr file)

{
  StringPtr pathStr;
  int iVar1;
  Compiler *pCVar2;
  undefined4 extraout_var;
  SourceFile local_110;
  uint64_t local_f0;
  uint64_t id;
  Maybe<capnp::compiler::Module_&> local_d8;
  Module *local_d0;
  Module *module;
  char *pcStack_c0;
  undefined1 local_b0 [8];
  DirPathPair dirPathPair;
  Maybe<const_kj::ReadableDirectory_&> local_80;
  ReadableDirectory *local_78;
  ReadableDirectory *dir;
  StringPtr path;
  StringPtr *__end3;
  StringPtr *__begin3;
  StringPtr (*__range3) [2];
  Own<capnp::compiler::Compiler> local_38;
  CompilerMain *local_28;
  CompilerMain *this_local;
  StringPtr file_local;
  
  file_local.content.ptr = (char *)file.content.size_;
  this_local = (CompilerMain *)file.content.ptr;
  local_28 = this;
  file_local.content.size_ = (size_t)__return_storage_ptr__;
  if ((this->compilerConstructed & 1U) == 0) {
    kj::SpaceFor<capnp::compiler::Compiler>::construct<capnp::compiler::Compiler::AnnotationFlag&>
              ((SpaceFor<capnp::compiler::Compiler> *)&local_38,
               (AnnotationFlag *)&this->compilerSpace);
    kj::Own<capnp::compiler::Compiler>::operator=(&this->compiler,&local_38);
    kj::Own<capnp::compiler::Compiler>::~Own(&local_38);
    this->compilerConstructed = true;
  }
  if ((this->addStandardImportPaths & 1U) != 0) {
    path.content.size_ = (size_t)&kj::DestructorOnlyDisposer<capnp::compiler::Compiler>::vtable;
    for (__end3 = addSource::STANDARD_IMPORT_PATHS; __end3 != (StringPtr *)path.content.size_;
        __end3 = __end3 + 1) {
      dirPathPair.path.parts.disposer = (ArrayDisposer *)(__end3->content).ptr;
      path.content.ptr = (char *)(__end3->content).size_;
      dir = (ReadableDirectory *)dirPathPair.path.parts.disposer;
      local_80 = getSourceDirectory(this,(StringPtr)__end3->content,false);
      local_78 = kj::_::readMaybe<kj::ReadableDirectory_const>(&local_80);
      if (local_78 != (ReadableDirectory *)0x0) {
        ModuleLoader::addImportPath(&this->loader,local_78);
      }
    }
    this->addStandardImportPaths = false;
  }
  module = (Module *)this_local;
  pcStack_c0 = file_local.content.ptr;
  pathStr.content.size_ = (size_t)file_local.content.ptr;
  pathStr.content.ptr = (char *)this_local;
  interpretSourceFile((DirPathPair *)local_b0,this,pathStr);
  kj::PathPtr::PathPtr((PathPtr *)&id,(Path *)&dirPathPair);
  local_d8 = ModuleLoader::loadModule(&this->loader,(ReadableDirectory *)local_b0,(PathPtr)_id);
  local_d0 = kj::_::readMaybe<capnp::compiler::Module>(&local_d8);
  if (local_d0 == (Module *)0x0) {
    kj::MainBuilder::Validity::Validity(__return_storage_ptr__,"no such file");
  }
  else {
    pCVar2 = kj::Own<capnp::compiler::Compiler>::operator->(&this->compiler);
    local_f0 = Compiler::add(pCVar2,local_d0);
    pCVar2 = kj::Own<capnp::compiler::Compiler>::operator->(&this->compiler);
    Compiler::eagerlyCompile(pCVar2,local_f0,this->compileEagerness);
    local_110.id = local_f0;
    iVar1 = (*(local_d0->super_ErrorReporter)._vptr_ErrorReporter[2])();
    local_110.name.content.ptr = (char *)CONCAT44(extraout_var,iVar1);
    local_110.module = local_d0;
    kj::Vector<capnp::compiler::CompilerMain::SourceFile>::
    add<capnp::compiler::CompilerMain::SourceFile>(&this->sourceFiles,&local_110);
    kj::MainBuilder::Validity::Validity(__return_storage_ptr__,true);
  }
  DirPathPair::~DirPathPair((DirPathPair *)local_b0);
  return __return_storage_ptr__;
}

Assistant:

kj::MainBuilder::Validity addSource(kj::StringPtr file) {
    if (!compilerConstructed) {
      compiler = compilerSpace.construct(annotationFlag);
      compilerConstructed = true;
    }

    if (addStandardImportPaths) {
      static constexpr kj::StringPtr STANDARD_IMPORT_PATHS[] = {
        "/usr/local/include"_kj,
        "/usr/include"_kj,
#ifdef CAPNP_INCLUDE_DIR
        KJ_CONCAT(CAPNP_INCLUDE_DIR, _kj),
#endif
      };
      for (auto path: STANDARD_IMPORT_PATHS) {
        KJ_IF_MAYBE(dir, getSourceDirectory(path, false)) {
          loader.addImportPath(*dir);
        } else {
          // ignore standard path that doesn't exist
        }
      }

      addStandardImportPaths = false;
    }

    auto dirPathPair = interpretSourceFile(file);
    KJ_IF_MAYBE(module, loader.loadModule(dirPathPair.dir, dirPathPair.path)) {
      uint64_t id = compiler->add(*module);
      compiler->eagerlyCompile(id, compileEagerness);
      sourceFiles.add(SourceFile { id, module->getSourceName(), &*module });
    } else {
      return "no such file";
    }